

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase1098::run(TestCase1098 *this)

{
  word **this_00;
  bool bVar1;
  uchar *puVar2;
  __off_t __length;
  ReaderFor<capnp::Data> RVar3;
  int local_1f0;
  bool local_1e9;
  int local_1e8;
  DebugExpression<int> DStack_1e4;
  bool _kj_shouldLog_1;
  undefined1 local_1e0 [8];
  DebugComparison<int,_const_unsigned_char_&> _kjCondition_1;
  size_t sStack_1b0;
  uint i;
  int local_1a8;
  bool local_1a1;
  size_t sStack_1a0;
  bool _kj_shouldLog;
  int local_198;
  DebugExpression<int> local_194;
  undefined1 local_190 [8];
  DebugComparison<int,_unsigned_long> _kjCondition;
  ReaderFor<capnp::Data> reader;
  Builder local_148;
  undefined1 local_120 [8];
  Orphan<capnp::Data> orphan;
  MallocMessageBuilder message;
  TestCase1098 *this_local;
  
  this_00 = &orphan.builder.location;
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)this_00,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAllTypes>
            (&local_148,(MessageBuilder *)this_00);
  capnproto_test::capnp::test::TestAllTypes::Builder::disownDataField
            ((Orphan<capnp::Data> *)local_120,&local_148);
  Orphan<capnp::Data>::truncate((Orphan<capnp::Data> *)local_120,(char *)0x3,__length);
  RVar3 = Orphan<capnp::Data>::getReader((Orphan<capnp::Data> *)local_120);
  _kjCondition._32_8_ = RVar3.super_ArrayPtr<const_unsigned_char>.ptr;
  local_198 = 3;
  local_194 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_198);
  sStack_1a0 = kj::ArrayPtr<const_unsigned_char>::size
                         ((ArrayPtr<const_unsigned_char> *)&_kjCondition.result);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_unsigned_long> *)local_190,&local_194,&stack0xfffffffffffffe60);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_190);
  if (!bVar1) {
    local_1a1 = kj::_::Debug::shouldLog(ERROR);
    while (local_1a1 != false) {
      local_1a8 = 3;
      sStack_1b0 = kj::ArrayPtr<const_unsigned_char>::size
                             ((ArrayPtr<const_unsigned_char> *)&_kjCondition.result);
      kj::_::Debug::
      log<char_const(&)[40],kj::_::DebugComparison<int,unsigned_long>&,int,unsigned_long>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x451,ERROR,
                 "\"failed: expected \" \"(3) == (reader.size())\", _kjCondition, 3, reader.size()",
                 (char (*) [40])"failed: expected (3) == (reader.size())",
                 (DebugComparison<int,_unsigned_long> *)local_190,&local_1a8,
                 &stack0xfffffffffffffe50);
      local_1a1 = false;
    }
  }
  for (_kjCondition_1._36_4_ = 0; (uint)_kjCondition_1._36_4_ < 3;
      _kjCondition_1._36_4_ = _kjCondition_1._36_4_ + 1) {
    local_1e8 = 0;
    DStack_1e4 = kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1e8);
    puVar2 = kj::ArrayPtr<const_unsigned_char>::operator[]
                       ((ArrayPtr<const_unsigned_char> *)&_kjCondition.result,
                        (ulong)(uint)_kjCondition_1._36_4_);
    kj::_::DebugExpression<int>::operator==
              ((DebugComparison<int,_const_unsigned_char_&> *)local_1e0,&stack0xfffffffffffffe1c,
               puVar2);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1e0);
    if (!bVar1) {
      local_1e9 = kj::_::Debug::shouldLog(ERROR);
      while (local_1e9 != false) {
        local_1f0 = 0;
        puVar2 = kj::ArrayPtr<const_unsigned_char>::operator[]
                           ((ArrayPtr<const_unsigned_char> *)&_kjCondition.result,
                            (ulong)(uint)_kjCondition_1._36_4_);
        kj::_::Debug::
        log<char_const(&)[36],kj::_::DebugComparison<int,unsigned_char_const&>&,int,unsigned_char_const&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
                   ,0x454,ERROR,
                   "\"failed: expected \" \"(0) == (reader[i])\", _kjCondition, 0, reader[i]",
                   (char (*) [36])"failed: expected (0) == (reader[i])",
                   (DebugComparison<int,_const_unsigned_char_&> *)local_1e0,&local_1f0,puVar2);
        local_1e9 = false;
      }
    }
  }
  Orphan<capnp::Data>::~Orphan((Orphan<capnp::Data> *)local_120);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&orphan.builder.location);
  return;
}

Assistant:

TEST(Orphans, ExtendDataFromEmpty) {
  MallocMessageBuilder message;

  auto orphan = message.initRoot<TestAllTypes>().disownDataField();
  orphan.truncate(3);

  auto reader = orphan.getReader();
  EXPECT_EQ(3, reader.size());

  for (uint i = 0; i < 3; i++) {
    EXPECT_EQ(0, reader[i]);
  }
}